

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo_x86.c
# Opt level: O0

void DetectSseViaOs(X86Features *features)

{
  StringView line_00;
  StringView line_01;
  StringView line_02;
  StringView line_03;
  StringView line_04;
  StringView line_05;
  _Bool _Var1;
  int fd_00;
  ulong *in_RDI;
  StringView value;
  StringView key;
  StringView line;
  LineResult result;
  StackLineReader reader;
  int fd;
  StringView in_stack_fffffffffffffb80;
  StringView in_stack_fffffffffffffb90;
  StackLineReader *in_stack_fffffffffffffbc0;
  byte local_430;
  char *in_stack_fffffffffffffbd8;
  StringView *in_stack_fffffffffffffbe0;
  StringView *in_stack_fffffffffffffbe8;
  StringView in_stack_fffffffffffffbf0;
  
  fd_00 = CpuFeatures_OpenFile(in_stack_fffffffffffffb80.ptr);
  if (-1 < fd_00) {
    StackLineReader_Initialize((StackLineReader *)&stack0xfffffffffffffbd8,fd_00);
    do {
      StackLineReader_NextLine(in_stack_fffffffffffffbc0);
      _Var1 = CpuFeatures_StringView_GetAttributeKeyValue
                        (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,
                         in_stack_fffffffffffffbe0);
      if (_Var1) {
        in_stack_fffffffffffffb80 = str(in_stack_fffffffffffffb80.ptr);
        _Var1 = CpuFeatures_StringView_IsEquals(in_stack_fffffffffffffb90,in_stack_fffffffffffffb80)
        ;
        if (_Var1) {
          line_00.size = (size_t)in_stack_fffffffffffffbe8;
          line_00.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_00,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xfffffffffff7ffff | (ulong)_Var1 << 0x13;
          line_01.size = (size_t)in_stack_fffffffffffffbe8;
          line_01.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_01,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xffffffffffefffff | (ulong)_Var1 << 0x14;
          line_02.size = (size_t)in_stack_fffffffffffffbe8;
          line_02.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_02,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xffffffffffdfffff | (ulong)_Var1 << 0x15;
          line_03.size = (size_t)in_stack_fffffffffffffbe8;
          line_03.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_03,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xffffffffffbfffff | (ulong)_Var1 << 0x16;
          line_04.size = (size_t)in_stack_fffffffffffffbe8;
          line_04.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_04,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xffffffffff7fffff | (ulong)_Var1 << 0x17;
          line_05.size = (size_t)in_stack_fffffffffffffbe8;
          line_05.ptr = (char *)in_stack_fffffffffffffbe0;
          _Var1 = CpuFeatures_StringView_HasWord(line_05,in_stack_fffffffffffffbd8);
          *in_RDI = *in_RDI & 0xfffffffffeffffff | (ulong)_Var1 << 0x18;
          break;
        }
      }
    } while ((local_430 & 1) == 0);
    CpuFeatures_CloseFile(0);
  }
  return;
}

Assistant:

static void DetectSseViaOs(X86Features* features) {
#if defined(CPU_FEATURES_OS_WINDOWS)
  // https://docs.microsoft.com/en-us/windows/win32/api/processthreadsapi/nf-processthreadsapi-isprocessorfeaturepresent
  features->sse =
      GetWindowsIsProcessorFeaturePresent(PF_XMMI_INSTRUCTIONS_AVAILABLE);
  features->sse2 =
      GetWindowsIsProcessorFeaturePresent(PF_XMMI64_INSTRUCTIONS_AVAILABLE);
  features->sse3 =
      GetWindowsIsProcessorFeaturePresent(PF_SSE3_INSTRUCTIONS_AVAILABLE);
#elif defined(CPU_FEATURES_OS_DARWIN)
  // Handling Darwin platform through sysctlbyname.
  features->sse = GetDarwinSysCtlByName("hw.optional.sse");
  features->sse2 = GetDarwinSysCtlByName("hw.optional.sse2");
  features->sse3 = GetDarwinSysCtlByName("hw.optional.sse3");
  features->ssse3 = GetDarwinSysCtlByName("hw.optional.supplementalsse3");
  features->sse4_1 = GetDarwinSysCtlByName("hw.optional.sse4_1");
  features->sse4_2 = GetDarwinSysCtlByName("hw.optional.sse4_2");
#elif defined(CPU_FEATURES_OS_LINUX_OR_ANDROID)
  // Handling Linux platform through /proc/cpuinfo.
  const int fd = CpuFeatures_OpenFile("/proc/cpuinfo");
  if (fd >= 0) {
    StackLineReader reader;
    StackLineReader_Initialize(&reader, fd);
    for (;;) {
      const LineResult result = StackLineReader_NextLine(&reader);
      const StringView line = result.line;
      StringView key, value;
      if (CpuFeatures_StringView_GetAttributeKeyValue(line, &key, &value)) {
        if (CpuFeatures_StringView_IsEquals(key, str("flags"))) {
          features->sse = CpuFeatures_StringView_HasWord(value, "sse");
          features->sse2 = CpuFeatures_StringView_HasWord(value, "sse2");
          features->sse3 = CpuFeatures_StringView_HasWord(value, "sse3");
          features->ssse3 = CpuFeatures_StringView_HasWord(value, "ssse3");
          features->sse4_1 = CpuFeatures_StringView_HasWord(value, "sse4_1");
          features->sse4_2 = CpuFeatures_StringView_HasWord(value, "sse4_2");
          break;
        }
      }
      if (result.eof) break;
    }
    CpuFeatures_CloseFile(fd);
  }
#else
#error "Unsupported fallback detection of SSE OS support."
#endif
}